

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_1048576,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 (*pauVar12) [12];
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  byte bVar35;
  BaseNode *node;
  ulong uVar36;
  float *pfVar37;
  uint uVar38;
  byte bVar39;
  undefined4 uVar40;
  ulong *puVar41;
  undefined1 auVar42 [8];
  Scene *pSVar43;
  uint *puVar44;
  int iVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar60;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  byte bVar61;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  float fVar62;
  byte bVar73;
  byte bVar75;
  byte bVar76;
  float fVar74;
  float fVar77;
  float fVar78;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar79;
  uint uVar80;
  float fVar81;
  uint uVar92;
  uint uVar94;
  vint4 ai_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar93;
  float fVar95;
  uint uVar96;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar97;
  uint uVar101;
  uint uVar102;
  vint4 bi;
  undefined1 auVar98 [16];
  uint uVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  uint uVar105;
  float fVar106;
  uint uVar107;
  float fVar108;
  uint uVar109;
  float fVar110;
  uint uVar111;
  uint uVar112;
  uint uVar116;
  uint uVar117;
  vint4 ai;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar118;
  uint uVar119;
  undefined1 auVar115 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar137;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar143;
  float fVar146;
  float fVar148;
  undefined1 auVar141 [16];
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar150 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar152 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_c5c;
  undefined1 local_c58 [8];
  float fStack_c50;
  float fStack_c4c;
  undefined8 local_c48;
  float fStack_c40;
  float fStack_c3c;
  undefined8 local_c38;
  float fStack_c30;
  float fStack_c2c;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  RayQueryContext *local_c00;
  uint *local_bf8;
  Scene *local_bf0;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  undefined1 local_bd8 [8];
  float fStack_bd0;
  float fStack_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined4 local_bc0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  uint local_bb0;
  uint local_bac;
  uint local_ba8;
  RTCFilterFunctionNArguments local_b98;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  undefined8 local_b58;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  long local_b40;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  undefined8 local_b28;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  undefined1 local_b08 [8];
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  ulong local_ae8;
  ulong local_ae0;
  ulong *local_ad8;
  ulong local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  undefined1 local_a18 [12];
  float fStack_a0c;
  undefined1 local_a08 [12];
  float fStack_9fc;
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [8];
  float fStack_980;
  float fStack_97c;
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined8 local_888;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined1 local_848 [16];
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  undefined1 auVar127 [12];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8 != 8) && (local_8c8 = ray->tfar, 0.0 <= local_8c8)) {
    local_ad8 = local_7d0;
    local_908 = (ray->org).field_0.m128[0];
    local_918 = (ray->org).field_0.m128[1];
    local_8d8 = (ray->org).field_0.m128[2];
    fVar60 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar16 = (ray->dir).field_0.field_1;
    auVar48._4_4_ = -(uint)(ABS(aVar16.y) < DAT_01f80d30._4_4_);
    auVar48._0_4_ = -(uint)(ABS(aVar16.x) < (float)DAT_01f80d30);
    auVar48._8_4_ = -(uint)(ABS(aVar16.z) < DAT_01f80d30._8_4_);
    auVar48._12_4_ = -(uint)(ABS(aVar16.field_3.w) < DAT_01f80d30._12_4_);
    auVar82 = blendvps((undefined1  [16])aVar16,_DAT_01f80d30,auVar48);
    local_8e8 = 0.0;
    if (0.0 <= fVar60) {
      local_8e8 = fVar60;
    }
    auVar48 = rcpps(auVar48,auVar82);
    local_928 = auVar48._0_4_;
    local_938 = auVar48._4_4_;
    local_8f8 = auVar48._8_4_;
    local_928 = (1.0 - auVar82._0_4_ * local_928) * local_928 + local_928;
    local_938 = (1.0 - auVar82._4_4_ * local_938) * local_938 + local_938;
    local_8f8 = (1.0 - auVar82._8_4_ * local_8f8) * local_8f8 + local_8f8;
    local_ae0 = (ulong)(local_928 < 0.0) << 2;
    uVar13 = (ulong)(local_938 < 0.0) * 4 + 8;
    local_ad0 = (ulong)(local_8f8 < 0.0);
    uVar14 = local_ad0 * 4 + 0x10;
    uVar46 = local_ae0 ^ 4;
    local_7e8 = mm_lookupmask_ps._0_16_;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    fStack_8c4 = local_8c8;
    fStack_8c0 = local_8c8;
    fStack_8bc = local_8c8;
    fStack_8d4 = local_8d8;
    fStack_8d0 = local_8d8;
    fStack_8cc = local_8d8;
    fStack_8e4 = local_8e8;
    fStack_8e0 = local_8e8;
    fStack_8dc = local_8e8;
    fStack_8f4 = local_8f8;
    fStack_8f0 = local_8f8;
    fStack_8ec = local_8f8;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    fStack_914 = local_918;
    fStack_910 = local_918;
    fStack_90c = local_918;
    fStack_934 = local_938;
    fStack_930 = local_938;
    fStack_92c = local_938;
    local_ac8 = mm_lookupmask_ps._240_8_;
    uStack_ac0 = mm_lookupmask_ps._248_8_;
    do {
      uVar47 = local_ad8[-1];
      local_ad8 = local_ad8 + -1;
      while ((uVar47 & 8) == 0) {
        uVar36 = uVar47 & 0xfffffffffffffff0;
        puVar41 = (ulong *)(uVar36 + 0x20);
        if (uVar36 == 0) {
          puVar41 = (ulong *)0x0;
        }
        uVar47 = *puVar41;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar47;
        uVar15 = *(undefined8 *)((long)puVar41 + 4);
        bVar39 = (byte)uVar47;
        bVar61 = (byte)uVar15;
        bVar23 = (byte)(uVar47 >> 8);
        bVar70 = (byte)((ulong)uVar15 >> 8);
        bVar24 = (byte)(uVar47 >> 0x10);
        bVar71 = (byte)((ulong)uVar15 >> 0x10);
        bVar25 = (byte)(uVar47 >> 0x18);
        bVar72 = (byte)((ulong)uVar15 >> 0x18);
        bVar26 = (byte)(uVar47 >> 0x20);
        bVar73 = (byte)((ulong)uVar15 >> 0x20);
        bVar27 = (byte)(uVar47 >> 0x28);
        bVar75 = (byte)((ulong)uVar15 >> 0x28);
        bVar28 = (byte)(uVar47 >> 0x30);
        bVar76 = (byte)((ulong)uVar15 >> 0x30);
        bVar35 = (byte)((ulong)uVar15 >> 0x38);
        bVar29 = (byte)(uVar47 >> 0x38);
        auVar114[0] = -((byte)((bVar39 < bVar61) * bVar39 | (bVar39 >= bVar61) * bVar61) == bVar39);
        auVar114[1] = -((byte)((bVar23 < bVar70) * bVar23 | (bVar23 >= bVar70) * bVar70) == bVar23);
        auVar114[2] = -((byte)((bVar24 < bVar71) * bVar24 | (bVar24 >= bVar71) * bVar71) == bVar24);
        auVar114[3] = -((byte)((bVar25 < bVar72) * bVar25 | (bVar25 >= bVar72) * bVar72) == bVar25);
        auVar114[4] = -((byte)((bVar26 < bVar73) * bVar26 | (bVar26 >= bVar73) * bVar73) == bVar26);
        auVar114[5] = -((byte)((bVar27 < bVar75) * bVar27 | (bVar27 >= bVar75) * bVar75) == bVar27);
        auVar114[6] = -((byte)((bVar28 < bVar76) * bVar28 | (bVar28 >= bVar76) * bVar76) == bVar28);
        auVar114[7] = -((byte)((bVar29 < bVar35) * bVar29 | (bVar29 >= bVar35) * bVar35) == bVar29);
        auVar114[8] = 0xff;
        auVar114[9] = 0xff;
        auVar114[10] = 0xff;
        auVar114[0xb] = 0xff;
        auVar114[0xc] = 0xff;
        auVar114[0xd] = 0xff;
        auVar114[0xe] = 0xff;
        auVar114[0xf] = 0xff;
        auVar83._8_4_ = 0xffffffff;
        auVar83._0_8_ = 0xffffffffffffffff;
        auVar83._12_4_ = 0xffffffff;
        auVar48 = pmovzxbd(auVar82,auVar114 ^ auVar83);
        auVar48 = auVar48 ^ auVar83;
        auVar85._0_4_ = auVar48._0_4_ << 0x1f;
        auVar85._4_4_ = auVar48._4_4_ << 0x1f;
        auVar85._8_4_ = auVar48._8_4_ << 0x1f;
        auVar85._12_4_ = auVar48._12_4_ << 0x1f;
        uVar38 = movmskps((int)local_ad0,auVar85);
        local_ad0 = (ulong)uVar38;
        fVar60 = *(float *)(puVar41 + 3);
        fVar95 = *(float *)((long)puVar41 + 0x1c);
        fVar79 = *(float *)((long)puVar41 + 0x24);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)((long)puVar41 + local_ae0);
        auVar48 = pmovzxbd(auVar49,auVar49);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)((long)puVar41 + uVar46);
        auVar82 = pmovzxbd(auVar50,auVar50);
        fVar118 = *(float *)(puVar41 + 5);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)((long)puVar41 + uVar13);
        auVar85 = pmovzxbd(auVar84,auVar84);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)((long)puVar41 + (uVar13 ^ 4));
        auVar49 = pmovzxbd(auVar86,auVar86);
        fVar81 = *(float *)((long)puVar41 + 0x2c);
        auVar98._8_8_ = 0;
        auVar98._0_8_ = *(ulong *)((long)puVar41 + uVar14);
        auVar50 = pmovzxbd(auVar98,auVar98);
        auVar113._8_8_ = 0;
        auVar113._0_8_ = *(ulong *)((long)puVar41 + (uVar14 ^ 4));
        auVar114 = pmovzxbd(auVar113,auVar113);
        fVar93 = *(float *)(puVar41 + 4);
        fVar62 = (((float)auVar48._0_4_ * fVar79 + fVar60) - local_908) * local_928;
        fVar74 = (((float)auVar48._4_4_ * fVar79 + fVar60) - fStack_904) * fStack_924;
        fVar77 = (((float)auVar48._8_4_ * fVar79 + fVar60) - fStack_900) * fStack_920;
        fVar78 = (((float)auVar48._12_4_ * fVar79 + fVar60) - fStack_8fc) * fStack_91c;
        fVar104 = (((float)auVar85._0_4_ * fVar118 + fVar95) - local_918) * local_938;
        fVar106 = (((float)auVar85._4_4_ * fVar118 + fVar95) - fStack_914) * fStack_934;
        fVar108 = (((float)auVar85._8_4_ * fVar118 + fVar95) - fStack_910) * fStack_930;
        fVar110 = (((float)auVar85._12_4_ * fVar118 + fVar95) - fStack_90c) * fStack_92c;
        uVar105 = (uint)((int)fVar104 < (int)fVar62) * (int)fVar62 |
                  (uint)((int)fVar104 >= (int)fVar62) * (int)fVar104;
        uVar107 = (uint)((int)fVar106 < (int)fVar74) * (int)fVar74 |
                  (uint)((int)fVar106 >= (int)fVar74) * (int)fVar106;
        uVar109 = (uint)((int)fVar108 < (int)fVar77) * (int)fVar77 |
                  (uint)((int)fVar108 >= (int)fVar77) * (int)fVar108;
        uVar111 = (uint)((int)fVar110 < (int)fVar78) * (int)fVar78 |
                  (uint)((int)fVar110 >= (int)fVar78) * (int)fVar110;
        fVar62 = (((float)auVar50._0_4_ * fVar81 + fVar93) - local_8d8) * local_8f8;
        fVar74 = (((float)auVar50._4_4_ * fVar81 + fVar93) - fStack_8d4) * fStack_8f4;
        fVar77 = (((float)auVar50._8_4_ * fVar81 + fVar93) - fStack_8d0) * fStack_8f0;
        fVar78 = (((float)auVar50._12_4_ * fVar81 + fVar93) - fStack_8cc) * fStack_8ec;
        uVar97 = (uint)((int)fVar62 < (int)local_8e8) * (int)local_8e8 |
                 (uint)((int)fVar62 >= (int)local_8e8) * (int)fVar62;
        uVar101 = (uint)((int)fVar74 < (int)fStack_8e4) * (int)fStack_8e4 |
                  (uint)((int)fVar74 >= (int)fStack_8e4) * (int)fVar74;
        uVar102 = (uint)((int)fVar77 < (int)fStack_8e0) * (int)fStack_8e0 |
                  (uint)((int)fVar77 >= (int)fStack_8e0) * (int)fVar77;
        uVar103 = (uint)((int)fVar78 < (int)fStack_8dc) * (int)fStack_8dc |
                  (uint)((int)fVar78 >= (int)fStack_8dc) * (int)fVar78;
        fVar62 = (((float)auVar82._0_4_ * fVar79 + fVar60) - local_908) * local_928;
        fVar74 = (((float)auVar82._4_4_ * fVar79 + fVar60) - fStack_904) * fStack_924;
        fVar77 = (((float)auVar82._8_4_ * fVar79 + fVar60) - fStack_900) * fStack_920;
        fVar60 = (((float)auVar82._12_4_ * fVar79 + fVar60) - fStack_8fc) * fStack_91c;
        fVar79 = (((float)auVar49._0_4_ * fVar118 + fVar95) - local_918) * local_938;
        fVar78 = (((float)auVar49._4_4_ * fVar118 + fVar95) - fStack_914) * fStack_934;
        fVar104 = (((float)auVar49._8_4_ * fVar118 + fVar95) - fStack_910) * fStack_930;
        fVar95 = (((float)auVar49._12_4_ * fVar118 + fVar95) - fStack_90c) * fStack_92c;
        uVar80 = (uint)((int)fVar62 < (int)fVar79) * (int)fVar62 |
                 (uint)((int)fVar62 >= (int)fVar79) * (int)fVar79;
        uVar92 = (uint)((int)fVar74 < (int)fVar78) * (int)fVar74 |
                 (uint)((int)fVar74 >= (int)fVar78) * (int)fVar78;
        uVar94 = (uint)((int)fVar77 < (int)fVar104) * (int)fVar77 |
                 (uint)((int)fVar77 >= (int)fVar104) * (int)fVar104;
        uVar96 = (uint)((int)fVar60 < (int)fVar95) * (int)fVar60 |
                 (uint)((int)fVar60 >= (int)fVar95) * (int)fVar95;
        fVar60 = (((float)auVar114._0_4_ * fVar81 + fVar93) - local_8d8) * local_8f8;
        fVar95 = (((float)auVar114._4_4_ * fVar81 + fVar93) - fStack_8d4) * fStack_8f4;
        fVar79 = (((float)auVar114._8_4_ * fVar81 + fVar93) - fStack_8d0) * fStack_8f0;
        fVar118 = (((float)auVar114._12_4_ * fVar81 + fVar93) - fStack_8cc) * fStack_8ec;
        uVar112 = (uint)((int)local_8c8 < (int)fVar60) * (int)local_8c8 |
                  (uint)((int)local_8c8 >= (int)fVar60) * (int)fVar60;
        uVar116 = (uint)((int)fStack_8c4 < (int)fVar95) * (int)fStack_8c4 |
                  (uint)((int)fStack_8c4 >= (int)fVar95) * (int)fVar95;
        uVar117 = (uint)((int)fStack_8c0 < (int)fVar79) * (int)fStack_8c0 |
                  (uint)((int)fStack_8c0 >= (int)fVar79) * (int)fVar79;
        uVar119 = (uint)((int)fStack_8bc < (int)fVar118) * (int)fStack_8bc |
                  (uint)((int)fStack_8bc >= (int)fVar118) * (int)fVar118;
        auVar99._0_4_ =
             -(uint)((int)(((int)uVar80 < (int)uVar112) * uVar80 |
                          ((int)uVar80 >= (int)uVar112) * uVar112) <
                    (int)(((int)uVar97 < (int)uVar105) * uVar105 |
                         ((int)uVar97 >= (int)uVar105) * uVar97));
        auVar99._4_4_ =
             -(uint)((int)(((int)uVar92 < (int)uVar116) * uVar92 |
                          ((int)uVar92 >= (int)uVar116) * uVar116) <
                    (int)(((int)uVar101 < (int)uVar107) * uVar107 |
                         ((int)uVar101 >= (int)uVar107) * uVar101));
        auVar99._8_4_ =
             -(uint)((int)(((int)uVar94 < (int)uVar117) * uVar94 |
                          ((int)uVar94 >= (int)uVar117) * uVar117) <
                    (int)(((int)uVar102 < (int)uVar109) * uVar109 |
                         ((int)uVar102 >= (int)uVar109) * uVar102));
        auVar99._12_4_ =
             -(uint)((int)(((int)uVar96 < (int)uVar119) * uVar96 |
                          ((int)uVar96 >= (int)uVar119) * uVar119) <
                    (int)(((int)uVar103 < (int)uVar111) * uVar111 |
                         ((int)uVar103 >= (int)uVar111) * uVar103));
        uVar40 = movmskps((int)puVar41,auVar99);
        bVar39 = ~(byte)uVar40 & (byte)uVar38;
        if (bVar39 == 0) goto LAB_0022be19;
        local_ad0 = (ulong)bVar39;
        lVar21 = 0;
        if (local_ad0 != 0) {
          for (; (bVar39 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar47 = *(ulong *)(uVar36 + lVar21 * 8);
        uVar38 = bVar39 - 1 & (uint)bVar39;
        if (uVar38 != 0) {
          *local_ad8 = uVar47;
          local_ad8 = local_ad8 + 1;
          lVar21 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar47 = *(ulong *)(uVar36 + lVar21 * 8);
          uVar38 = uVar38 - 1 & uVar38;
          local_ad0 = (ulong)uVar38;
          if (uVar38 != 0) {
            do {
              *local_ad8 = uVar47;
              local_ad8 = local_ad8 + 1;
              lVar21 = 0;
              if (local_ad0 != 0) {
                for (; (local_ad0 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              uVar47 = *(ulong *)(uVar36 + lVar21 * 8);
              local_ad0 = local_ad0 & local_ad0 - 1;
            } while (local_ad0 != 0);
          }
        }
      }
      local_ae8 = (ulong)((uint)uVar47 & 0xf) - 8;
      if (local_ae8 != 0) {
        local_ad0 = 0;
        local_c00 = context;
        do {
          pSVar43 = context->scene;
          puVar1 = (uint *)((uVar47 & 0xfffffffffffffff0) + local_ad0 * 0x60);
          puVar44 = puVar1 + 0x10;
          local_bf0 = pSVar43;
          ppfVar17 = (pSVar43->vertices).items;
          pfVar18 = ppfVar17[*puVar44];
          pfVar2 = pfVar18 + *puVar1;
          pfVar3 = pfVar18 + puVar1[4];
          pfVar4 = pfVar18 + puVar1[0xc];
          pfVar37 = ppfVar17[puVar1[0x11]];
          pfVar5 = pfVar37 + puVar1[1];
          pfVar6 = pfVar37 + puVar1[5];
          pfVar7 = pfVar37 + puVar1[0xd];
          pfVar19 = ppfVar17[puVar1[0x12]];
          pfVar8 = pfVar19 + puVar1[2];
          pfVar9 = pfVar19 + puVar1[0xe];
          pfVar20 = ppfVar17[puVar1[0x13]];
          pfVar10 = pfVar20 + puVar1[3];
          pfVar11 = pfVar20 + puVar1[0xf];
          local_b58 = CONCAT44(pfVar6[2],pfVar3[2]);
          fStack_b48 = pfVar19[(ulong)puVar1[6] + 2];
          fStack_b44 = pfVar20[(ulong)puVar1[7] + 2];
          local_b28 = CONCAT44(*pfVar6,*pfVar3);
          local_a48 = (ray->org).field_0.m128[0];
          local_a38 = (ray->org).field_0.m128[1];
          local_a28 = (ray->org).field_0.m128[2];
          local_b08._0_4_ = pfVar2[1] - local_a38;
          local_b08._4_4_ = pfVar5[1] - local_a38;
          fStack_b00 = pfVar8[1] - local_a38;
          fStack_afc = pfVar10[1] - local_a38;
          local_af8 = pfVar2[2] - local_a28;
          fStack_af4 = pfVar5[2] - local_a28;
          fStack_af0 = pfVar8[2] - local_a28;
          fStack_aec = pfVar10[2] - local_a28;
          fStack_8a0 = pfVar9[1];
          fStack_89c = pfVar11[1];
          local_c38._0_4_ = pfVar4[1] - local_a38;
          local_c38._4_4_ = pfVar7[1] - local_a38;
          fStack_c30 = pfVar9[1] - local_a38;
          fStack_c2c = pfVar11[1] - local_a38;
          local_888 = CONCAT44(pfVar7[2],pfVar4[2]);
          local_bd8._0_4_ = pfVar4[2] - local_a28;
          local_bd8._4_4_ = pfVar7[2] - local_a28;
          fStack_bd0 = pfVar9[2] - local_a28;
          fStack_bcc = pfVar11[2] - local_a28;
          local_808 = (float)local_c38 - (float)local_b08._0_4_;
          fStack_804 = local_c38._4_4_ - (float)local_b08._4_4_;
          fStack_800 = fStack_c30 - fStack_b00;
          fStack_7fc = fStack_c2c - fStack_afc;
          local_7f8 = (float)local_bd8._0_4_ - local_af8;
          fStack_7f4 = (float)local_bd8._4_4_ - fStack_af4;
          fStack_7f0 = fStack_bd0 - fStack_af0;
          fStack_7ec = fStack_bcc - fStack_aec;
          fVar81 = *pfVar2 - local_a48;
          fVar93 = *pfVar5 - local_a48;
          fStack_c40 = *pfVar8 - local_a48;
          fStack_c3c = *pfVar10 - local_a48;
          local_8b8 = CONCAT44(*pfVar7,*pfVar4);
          local_8a8 = *pfVar9;
          fStack_8a4 = *pfVar11;
          local_a58 = *pfVar4 - local_a48;
          fStack_a54 = *pfVar7 - local_a48;
          fStack_a50 = *pfVar9 - local_a48;
          fStack_a4c = *pfVar11 - local_a48;
          local_818 = local_a58 - fVar81;
          fStack_814 = fStack_a54 - fVar93;
          fStack_810 = fStack_a50 - fStack_c40;
          fStack_80c = fStack_a4c - fStack_c3c;
          local_b38 = (ray->dir).field_0.m128[0];
          local_c18 = (ray->dir).field_0.m128[1];
          local_be8 = (ray->dir).field_0.m128[2];
          fVar134 = (local_808 * ((float)local_bd8._0_4_ + local_af8) -
                    local_7f8 * ((float)local_c38 + (float)local_b08._0_4_)) * local_b38 +
                    (local_7f8 * (local_a58 + fVar81) -
                    ((float)local_bd8._0_4_ + local_af8) * local_818) * local_c18 +
                    (((float)local_c38 + (float)local_b08._0_4_) * local_818 -
                    (local_a58 + fVar81) * local_808) * local_be8;
          fVar137 = (fStack_804 * ((float)local_bd8._4_4_ + fStack_af4) -
                    fStack_7f4 * (local_c38._4_4_ + (float)local_b08._4_4_)) * local_b38 +
                    (fStack_7f4 * (fStack_a54 + fVar93) -
                    ((float)local_bd8._4_4_ + fStack_af4) * fStack_814) * local_c18 +
                    ((local_c38._4_4_ + (float)local_b08._4_4_) * fStack_814 -
                    (fStack_a54 + fVar93) * fStack_804) * local_be8;
          local_a18._0_8_ = CONCAT44(fVar137,fVar134);
          local_a18._8_4_ =
               (fStack_800 * (fStack_bd0 + fStack_af0) - fStack_7f0 * (fStack_c30 + fStack_b00)) *
               local_b38 +
               (fStack_7f0 * (fStack_a50 + fStack_c40) - (fStack_bd0 + fStack_af0) * fStack_810) *
               local_c18 +
               ((fStack_c30 + fStack_b00) * fStack_810 - (fStack_a50 + fStack_c40) * fStack_800) *
               local_be8;
          fStack_a0c = (fStack_7fc * (fStack_bcc + fStack_aec) -
                       fStack_7ec * (fStack_c2c + fStack_afc)) * local_b38 +
                       (fStack_7ec * (fStack_a4c + fStack_c3c) -
                       (fStack_bcc + fStack_aec) * fStack_80c) * local_c18 +
                       ((fStack_c2c + fStack_afc) * fStack_80c -
                       (fStack_a4c + fStack_c3c) * fStack_7fc) * local_be8;
          local_898 = pfVar3[1];
          fStack_894 = pfVar6[1];
          fStack_890 = pfVar19[(ulong)puVar1[6] + 1];
          fStack_88c = pfVar20[(ulong)puVar1[7] + 1];
          fStack_a34 = local_a38;
          fStack_a30 = local_a38;
          fStack_a2c = local_a38;
          local_a98 = pfVar3[1] - local_a38;
          fStack_a94 = pfVar6[1] - local_a38;
          fStack_a90 = pfVar19[(ulong)puVar1[6] + 1] - local_a38;
          fStack_a8c = pfVar20[(ulong)puVar1[7] + 1] - local_a38;
          fStack_a24 = local_a28;
          fStack_a20 = local_a28;
          fStack_a1c = local_a28;
          local_ab8 = pfVar3[2] - local_a28;
          fStack_ab4 = pfVar6[2] - local_a28;
          fStack_ab0 = fStack_b50 - local_a28;
          fStack_aac = fStack_b4c - local_a28;
          local_b18 = (float)local_b08._0_4_ - local_a98;
          fStack_b14 = (float)local_b08._4_4_ - fStack_a94;
          fStack_b10 = fStack_b00 - fStack_a90;
          fStack_b0c = fStack_afc - fStack_a8c;
          fVar62 = local_af8 - local_ab8;
          fVar74 = fStack_af4 - fStack_ab4;
          fVar77 = fStack_af0 - fStack_ab0;
          fVar78 = fStack_aec - fStack_aac;
          fStack_a44 = local_a48;
          fStack_a40 = local_a48;
          fStack_a3c = local_a48;
          local_aa8 = *pfVar3 - local_a48;
          fStack_aa4 = *pfVar6 - local_a48;
          fStack_aa0 = fStack_b20 - local_a48;
          fStack_a9c = fStack_b1c - local_a48;
          local_838 = fVar81 - local_aa8;
          fStack_834 = fVar93 - fStack_aa4;
          fStack_830 = fStack_c40 - fStack_aa0;
          fStack_82c = fStack_c3c - fStack_a9c;
          fVar104 = (local_b18 * (local_af8 + local_ab8) -
                    fVar62 * ((float)local_b08._0_4_ + local_a98)) * local_b38 +
                    (fVar62 * (fVar81 + local_aa8) - (local_af8 + local_ab8) * local_838) *
                    local_c18 +
                    (((float)local_b08._0_4_ + local_a98) * local_838 -
                    (fVar81 + local_aa8) * local_b18) * local_be8;
          fVar106 = (fStack_b14 * (fStack_af4 + fStack_ab4) -
                    fVar74 * ((float)local_b08._4_4_ + fStack_a94)) * local_b38 +
                    (fVar74 * (fVar93 + fStack_aa4) - (fStack_af4 + fStack_ab4) * fStack_834) *
                    local_c18 +
                    (((float)local_b08._4_4_ + fStack_a94) * fStack_834 -
                    (fVar93 + fStack_aa4) * fStack_b14) * local_be8;
          local_848._0_8_ = CONCAT44(fVar106,fVar104);
          local_848._8_4_ =
               (fStack_b10 * (fStack_af0 + fStack_ab0) - fVar77 * (fStack_b00 + fStack_a90)) *
               local_b38 +
               (fVar77 * (fStack_c40 + fStack_aa0) - (fStack_af0 + fStack_ab0) * fStack_830) *
               local_c18 +
               ((fStack_b00 + fStack_a90) * fStack_830 - (fStack_c40 + fStack_aa0) * fStack_b10) *
               local_be8;
          local_848._12_4_ =
               (fStack_b0c * (fStack_aec + fStack_aac) - fVar78 * (fStack_afc + fStack_a8c)) *
               local_b38 +
               (fVar78 * (fStack_c3c + fStack_a9c) - (fStack_aec + fStack_aac) * fStack_82c) *
               local_c18 +
               ((fStack_afc + fStack_a8c) * fStack_82c - (fStack_c3c + fStack_a9c) * fStack_b0c) *
               local_be8;
          fVar138 = local_a98 - (float)local_c38;
          fVar143 = fStack_a94 - local_c38._4_4_;
          fVar146 = fStack_a90 - fStack_c30;
          fVar148 = fStack_a8c - fStack_c2c;
          local_828 = local_ab8 - (float)local_bd8._0_4_;
          fStack_824 = fStack_ab4 - (float)local_bd8._4_4_;
          fStack_820 = fStack_ab0 - fStack_bd0;
          fStack_81c = fStack_aac - fStack_bcc;
          local_a68 = local_a98 + (float)local_c38;
          fStack_a64 = fStack_a94 + local_c38._4_4_;
          fStack_a60 = fStack_a90 + fStack_c30;
          fStack_a5c = fStack_a8c + fStack_c2c;
          local_a78 = local_ab8 + (float)local_bd8._0_4_;
          fStack_a74 = fStack_ab4 + (float)local_bd8._4_4_;
          fStack_a70 = fStack_ab0 + fStack_bd0;
          fStack_a6c = fStack_aac + fStack_bcc;
          fVar108 = local_aa8 - local_a58;
          fVar110 = fStack_aa4 - fStack_a54;
          fStack_b60 = fStack_aa0 - fStack_a50;
          fStack_b5c = fStack_a9c - fStack_a4c;
          local_a88 = local_aa8 + local_a58;
          fStack_a84 = fStack_aa4 + fStack_a54;
          fStack_a80 = fStack_aa0 + fStack_a50;
          fStack_a7c = fStack_a9c + fStack_a4c;
          fStack_be4 = local_be8;
          fStack_be0 = local_be8;
          fStack_bdc = local_be8;
          fStack_c14 = local_c18;
          fStack_c10 = local_c18;
          fStack_c0c = local_c18;
          fStack_b34 = local_b38;
          fStack_b30 = local_b38;
          fStack_b2c = local_b38;
          auVar51._0_4_ =
               (fVar138 * local_a78 - local_828 * local_a68) * local_b38 +
               (local_828 * local_a88 - fVar108 * local_a78) * local_c18 +
               (fVar108 * local_a68 - fVar138 * local_a88) * local_be8;
          auVar51._4_4_ =
               (fVar143 * fStack_a74 - fStack_824 * fStack_a64) * local_b38 +
               (fStack_824 * fStack_a84 - fVar110 * fStack_a74) * local_c18 +
               (fVar110 * fStack_a64 - fVar143 * fStack_a84) * local_be8;
          auVar51._8_4_ =
               (fVar146 * fStack_a70 - fStack_820 * fStack_a60) * local_b38 +
               (fStack_820 * fStack_a80 - fStack_b60 * fStack_a70) * local_c18 +
               (fStack_b60 * fStack_a60 - fVar146 * fStack_a80) * local_be8;
          auVar51._12_4_ =
               (fVar148 * fStack_a6c - fStack_81c * fStack_a5c) * local_b38 +
               (fStack_81c * fStack_a7c - fStack_b5c * fStack_a6c) * local_c18 +
               (fStack_b5c * fStack_a5c - fVar148 * fStack_a7c) * local_be8;
          local_9f8._0_4_ = fVar134 + fVar104 + auVar51._0_4_;
          local_9f8._4_4_ = fVar137 + fVar106 + auVar51._4_4_;
          local_9f8._8_4_ = (float)local_a18._8_4_ + local_848._8_4_ + auVar51._8_4_;
          local_9f8._12_4_ = fStack_a0c + local_848._12_4_ + auVar51._12_4_;
          auVar63._8_4_ = local_a18._8_4_;
          auVar63._0_8_ = local_a18._0_8_;
          auVar63._12_4_ = fStack_a0c;
          auVar48 = minps(auVar63,local_848);
          auVar48 = minps(auVar48,auVar51);
          auVar128._8_4_ = local_a18._8_4_;
          auVar128._0_8_ = local_a18._0_8_;
          auVar128._12_4_ = fStack_a0c;
          auVar82 = maxps(auVar128,local_848);
          auVar82 = maxps(auVar82,auVar51);
          fVar60 = ABS(local_9f8._0_4_) * 1.1920929e-07;
          fVar95 = ABS(local_9f8._4_4_) * 1.1920929e-07;
          fVar79 = ABS(local_9f8._8_4_) * 1.1920929e-07;
          fVar118 = ABS(local_9f8._12_4_) * 1.1920929e-07;
          auVar129._4_4_ = -(uint)(auVar82._4_4_ <= fVar95);
          auVar129._0_4_ = -(uint)(auVar82._0_4_ <= fVar60);
          auVar129._8_4_ = -(uint)(auVar82._8_4_ <= fVar79);
          auVar129._12_4_ = -(uint)(auVar82._12_4_ <= fVar118);
          auVar64._4_4_ = -(uint)(-fVar95 <= auVar48._4_4_);
          auVar64._0_4_ = -(uint)(-fVar60 <= auVar48._0_4_);
          auVar64._8_4_ = -(uint)(-fVar79 <= auVar48._8_4_);
          auVar64._12_4_ = -(uint)(-fVar118 <= auVar48._12_4_);
          auVar129 = auVar129 | auVar64;
          local_b40 = (uVar47 & 0xfffffffffffffff0) + local_ad0 * 0x60;
          local_bf8 = puVar44;
          iVar45 = movmskps((int)&local_7d8,auVar129);
          pauVar12 = (undefined1 (*) [12])(pfVar18 + puVar1[8]);
          auVar127 = *pauVar12;
          local_c28 = (float)*(undefined8 *)*pauVar12;
          fStack_c24 = (float)((ulong)*(undefined8 *)*pauVar12 >> 0x20);
          fStack_c20 = (float)*(undefined8 *)(*pauVar12 + 8);
          fStack_c1c = (float)((ulong)*(undefined8 *)(*pauVar12 + 8) >> 0x20);
          local_858 = *(undefined8 *)(pfVar37 + puVar1[9]);
          uStack_850 = *(undefined8 *)(pfVar37 + puVar1[9] + 2);
          local_878 = *(undefined8 *)(pfVar19 + puVar1[10]);
          uStack_870 = *(undefined8 *)(pfVar19 + puVar1[10] + 2);
          local_868 = *(undefined8 *)(pfVar20 + puVar1[0xb]);
          uStack_860 = *(undefined8 *)(pfVar20 + puVar1[0xb] + 2);
          context = local_c00;
          if (iVar45 == 0) {
            auVar89._4_4_ = local_b38;
            auVar89._0_4_ = local_b38;
            auVar89._8_4_ = local_b38;
            auVar89._12_4_ = local_b38;
          }
          else {
            _local_b68 = CONCAT44(fVar110,fVar108);
            auVar115._0_4_ = local_b18 * local_828 - fVar62 * fVar138;
            auVar115._4_4_ = fStack_b14 * fStack_824 - fVar74 * fVar143;
            auVar115._8_4_ = fStack_b10 * fStack_820 - fVar77 * fVar146;
            auVar115._12_4_ = fStack_b0c * fStack_81c - fVar78 * fVar148;
            auVar52._4_4_ = -(uint)(ABS(fStack_7f4 * fStack_b14) < ABS(fVar74 * fVar143));
            auVar52._0_4_ = -(uint)(ABS(local_7f8 * local_b18) < ABS(fVar62 * fVar138));
            auVar52._8_4_ = -(uint)(ABS(fStack_7f0 * fStack_b10) < ABS(fVar77 * fVar146));
            auVar52._12_4_ = -(uint)(ABS(fStack_7ec * fStack_b0c) < ABS(fVar78 * fVar148));
            auVar31._4_4_ = fStack_804 * fVar74 - fStack_7f4 * fStack_b14;
            auVar31._0_4_ = local_808 * fVar62 - local_7f8 * local_b18;
            auVar31._8_4_ = fStack_800 * fVar77 - fStack_7f0 * fStack_b10;
            auVar31._12_4_ = fStack_7fc * fVar78 - fStack_7ec * fStack_b0c;
            local_9e8 = blendvps(auVar115,auVar31,auVar52);
            auVar120._0_4_ = local_7f8 * local_838 - local_818 * fVar62;
            auVar120._4_4_ = fStack_7f4 * fStack_834 - fStack_814 * fVar74;
            auVar120._8_4_ = fStack_7f0 * fStack_830 - fStack_810 * fVar77;
            auVar120._12_4_ = fStack_7ec * fStack_82c - fStack_80c * fVar78;
            auVar141._0_4_ = fVar62 * fVar108 - local_838 * local_828;
            auVar141._4_4_ = fVar74 * fVar110 - fStack_834 * fStack_824;
            auVar141._8_4_ = fVar77 * fStack_b60 - fStack_830 * fStack_820;
            auVar141._12_4_ = fVar78 * fStack_b5c - fStack_82c * fStack_81c;
            auVar53._4_4_ = -(uint)(ABS(fStack_814 * fVar74) < ABS(fStack_834 * fStack_824));
            auVar53._0_4_ = -(uint)(ABS(local_818 * fVar62) < ABS(local_838 * local_828));
            auVar53._8_4_ = -(uint)(ABS(fStack_810 * fVar77) < ABS(fStack_830 * fStack_820));
            auVar53._12_4_ = -(uint)(ABS(fStack_80c * fVar78) < ABS(fStack_82c * fStack_81c));
            _local_c58 = blendvps(auVar141,auVar120,auVar53);
            auVar132._0_4_ = local_838 * fVar138 - local_b18 * fVar108;
            auVar132._4_4_ = fStack_834 * fVar143 - fStack_b14 * fVar110;
            auVar132._8_4_ = fStack_830 * fVar146 - fStack_b10 * fStack_b60;
            auVar132._12_4_ = fStack_82c * fVar148 - fStack_b0c * fStack_b5c;
            auVar54._4_4_ = -(uint)(ABS(fStack_804 * fStack_834) < ABS(fStack_b14 * fVar110));
            auVar54._0_4_ = -(uint)(ABS(local_808 * local_838) < ABS(local_b18 * fVar108));
            auVar54._8_4_ = -(uint)(ABS(fStack_800 * fStack_830) < ABS(fStack_b10 * fStack_b60));
            auVar54._12_4_ = -(uint)(ABS(fStack_7fc * fStack_82c) < ABS(fStack_b0c * fStack_b5c));
            auVar30._4_4_ = fStack_814 * fStack_b14 - fStack_804 * fStack_834;
            auVar30._0_4_ = local_818 * local_b18 - local_808 * local_838;
            auVar30._8_4_ = fStack_810 * fStack_b10 - fStack_800 * fStack_830;
            auVar30._12_4_ = fStack_80c * fStack_b0c - fStack_7fc * fStack_82c;
            local_9c8 = blendvps(auVar132,auVar30,auVar54);
            auVar89._4_4_ = local_b38;
            auVar89._0_4_ = local_b38;
            auVar89._8_4_ = local_b38;
            auVar89._12_4_ = local_b38;
            fVar60 = local_b38 * local_9e8._0_4_ +
                     local_c18 * local_c58._0_4_ + local_be8 * local_9c8._0_4_;
            fVar95 = local_b38 * local_9e8._4_4_ +
                     local_c18 * local_c58._4_4_ + local_be8 * local_9c8._4_4_;
            fVar79 = local_b38 * local_9e8._8_4_ +
                     local_c18 * local_c58._8_4_ + local_be8 * local_9c8._8_4_;
            fVar118 = local_b38 * local_9e8._12_4_ +
                      local_c18 * local_c58._12_4_ + local_be8 * local_9c8._12_4_;
            auVar55._0_4_ = fVar60 + fVar60;
            auVar55._4_4_ = fVar95 + fVar95;
            auVar55._8_4_ = fVar79 + fVar79;
            auVar55._12_4_ = fVar118 + fVar118;
            auVar87._0_4_ = (float)local_b08._0_4_ * local_c58._0_4_ + local_af8 * local_9c8._0_4_;
            auVar87._4_4_ = (float)local_b08._4_4_ * local_c58._4_4_ + fStack_af4 * local_9c8._4_4_;
            auVar87._8_4_ = fStack_b00 * local_c58._8_4_ + fStack_af0 * local_9c8._8_4_;
            auVar87._12_4_ = fStack_afc * local_c58._12_4_ + fStack_aec * local_9c8._12_4_;
            fVar77 = fVar81 * local_9e8._0_4_ + auVar87._0_4_;
            fVar78 = fVar93 * local_9e8._4_4_ + auVar87._4_4_;
            fVar108 = fStack_c40 * local_9e8._8_4_ + auVar87._8_4_;
            fVar110 = fStack_c3c * local_9e8._12_4_ + auVar87._12_4_;
            auVar48 = rcpps(auVar87,auVar55);
            fVar60 = auVar48._0_4_;
            fVar95 = auVar48._4_4_;
            fVar118 = auVar48._8_4_;
            fVar81 = auVar48._12_4_;
            fVar93 = (float)DAT_01f7ba10;
            fVar62 = DAT_01f7ba10._4_4_;
            fVar74 = DAT_01f7ba10._12_4_;
            fVar79 = DAT_01f7ba10._8_4_;
            local_988._0_4_ =
                 ((fVar93 - auVar55._0_4_ * fVar60) * fVar60 + fVar60) * (fVar77 + fVar77);
            local_988._4_4_ =
                 ((fVar62 - auVar55._4_4_ * fVar95) * fVar95 + fVar95) * (fVar78 + fVar78);
            fStack_980 = ((fVar79 - auVar55._8_4_ * fVar118) * fVar118 + fVar118) *
                         (fVar108 + fVar108);
            fStack_97c = ((fVar74 - auVar55._12_4_ * fVar81) * fVar81 + fVar81) *
                         (fVar110 + fVar110);
            fVar60 = ray->tfar;
            fVar95 = (ray->org).field_0.m128[3];
            local_9b8._0_4_ =
                 -(uint)(auVar55._0_4_ != 0.0) & auVar129._0_4_ &
                 -(uint)((float)local_988._0_4_ <= fVar60 && fVar95 <= (float)local_988._0_4_);
            local_9b8._4_4_ =
                 -(uint)(auVar55._4_4_ != 0.0) & auVar129._4_4_ &
                 -(uint)((float)local_988._4_4_ <= fVar60 && fVar95 <= (float)local_988._4_4_);
            local_9b8._8_4_ =
                 -(uint)(auVar55._8_4_ != 0.0) & auVar129._8_4_ &
                 -(uint)(fStack_980 <= fVar60 && fVar95 <= fStack_980);
            local_9b8._12_4_ =
                 -(uint)(auVar55._12_4_ != 0.0) & auVar129._12_4_ &
                 -(uint)(fStack_97c <= fVar60 && fVar95 <= fStack_97c);
            uVar38 = movmskps((int)pfVar37,local_9b8);
            pfVar37 = (float *)(ulong)uVar38;
            auVar130._12_4_ = fStack_c1c;
            auVar130._0_12_ = *pauVar12;
            auVar127 = *pauVar12;
            if (uVar38 != 0) {
              local_a08._8_4_ = local_848._8_4_;
              local_a08._0_8_ = local_848._0_8_;
              fStack_9fc = local_848._12_4_;
              local_9d8 = _local_c58;
              local_948 = local_7e8;
              auVar48 = rcpps(auVar89,local_9f8);
              fVar60 = auVar48._0_4_;
              fVar95 = auVar48._4_4_;
              fVar118 = auVar48._8_4_;
              fVar81 = auVar48._12_4_;
              fVar60 = (float)(-(uint)(1e-18 <= ABS(local_9f8._0_4_)) &
                              (uint)((fVar93 - local_9f8._0_4_ * fVar60) * fVar60 + fVar60));
              fVar95 = (float)(-(uint)(1e-18 <= ABS(local_9f8._4_4_)) &
                              (uint)((fVar62 - local_9f8._4_4_ * fVar95) * fVar95 + fVar95));
              fVar118 = (float)(-(uint)(1e-18 <= ABS(local_9f8._8_4_)) &
                               (uint)((fVar79 - local_9f8._8_4_ * fVar118) * fVar118 + fVar118));
              fVar81 = (float)(-(uint)(1e-18 <= ABS(local_9f8._12_4_)) &
                              (uint)((fVar74 - local_9f8._12_4_ * fVar81) * fVar81 + fVar81));
              auVar135._0_4_ = fVar134 * fVar60;
              auVar135._4_4_ = fVar137 * fVar95;
              auVar135._8_4_ = (float)local_a18._8_4_ * fVar118;
              auVar135._12_4_ = fStack_a0c * fVar81;
              auVar48 = minps(auVar135,_DAT_01f7ba10);
              auVar150._0_4_ = fVar60 * fVar104;
              auVar150._4_4_ = fVar95 * fVar106;
              auVar150._8_4_ = fVar118 * local_848._8_4_;
              auVar150._12_4_ = fVar81 * local_848._12_4_;
              auVar82 = minps(auVar150,_DAT_01f7ba10);
              auVar65._0_4_ = fVar93 - auVar48._0_4_;
              auVar65._4_4_ = fVar62 - auVar48._4_4_;
              auVar65._8_4_ = fVar79 - auVar48._8_4_;
              auVar65._12_4_ = fVar74 - auVar48._12_4_;
              auVar88._0_4_ = fVar93 - auVar82._0_4_;
              auVar88._4_4_ = fVar62 - auVar82._4_4_;
              auVar88._8_4_ = fVar79 - auVar82._8_4_;
              auVar88._12_4_ = fVar74 - auVar82._12_4_;
              local_9a8 = blendvps(auVar48,auVar65,local_7e8);
              local_998 = blendvps(auVar82,auVar88,local_7e8);
              local_978 = local_9e8;
              local_968 = _local_c58;
              local_958 = local_9c8;
              local_c48 = (RTCIntersectArguments *)(ulong)(byte)uVar38;
              do {
                uVar36 = 0;
                if (local_c48 != (RTCIntersectArguments *)0x0) {
                  for (; ((ulong)local_c48 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                pfVar37 = (float *)(ulong)puVar44[uVar36];
                local_c38 = (pSVar43->geometries).items[(long)pfVar37].ptr;
                if ((local_c38->mask & ray->mask) == 0) {
                  local_c48 = (RTCIntersectArguments *)((ulong)local_c48 ^ 1L << (uVar36 & 0x3f));
                }
                else {
                  auVar42 = (undefined1  [8])context->args;
                  if ((((RTCIntersectArguments *)auVar42)->filter == (RTCFilterFunctionN)0x0) &&
                     (local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0022be29;
                  local_b98.context = context->user;
                  local_bc8 = *(undefined4 *)(local_978 + uVar36 * 4);
                  local_bc4 = *(undefined4 *)(local_968 + uVar36 * 4);
                  local_bc0 = *(undefined4 *)(local_958 + uVar36 * 4);
                  local_bbc = *(undefined4 *)(local_9a8 + uVar36 * 4);
                  local_bb8 = *(undefined4 *)(local_998 + uVar36 * 4);
                  local_bb4 = *(undefined4 *)(local_b40 + 0x50 + uVar36 * 4);
                  local_bb0 = puVar44[uVar36];
                  local_bac = (local_b98.context)->instID[0];
                  local_ba8 = (local_b98.context)->instPrimID[0];
                  local_be8 = ray->tfar;
                  local_c18 = (float)uVar36;
                  fStack_c14 = (float)(uVar36 >> 0x20);
                  ray->tfar = *(float *)(local_988 + uVar36 * 4);
                  local_c5c = -1;
                  local_b98.valid = &local_c5c;
                  local_b98.geometryUserPtr = local_c38->userPtr;
                  local_c58 = (undefined1  [8])ray;
                  local_b98.hit = (RTCHitN *)&local_bc8;
                  local_b98.N = 1;
                  local_b98.ray = (RTCRayN *)ray;
                  if (local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0022b520:
                    ray = (Ray *)local_c58;
                    if ((((RTCIntersectArguments *)auVar42)->filter == (RTCFilterFunctionN)0x0) ||
                       (((((RTCIntersectArguments *)auVar42)->flags &
                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                        && (((local_c38->field_8).field_0x2 & 0x40) == 0)))) goto LAB_0022be29;
                    (*((RTCIntersectArguments *)auVar42)->filter)(&local_b98);
                    ray = (Ray *)local_c58;
                    if (*local_b98.valid != 0) goto LAB_0022be29;
                  }
                  else {
                    local_bd8 = auVar42;
                    (*local_c38->occlusionFilterN)(&local_b98);
                    auVar42 = local_bd8;
                    if (*local_b98.valid != 0) goto LAB_0022b520;
                  }
                  *(float *)((long)local_c58 + 0x20) = local_be8;
                  pfVar37 = (float *)(ulong)(uint)local_c18;
                  local_c48 = (RTCIntersectArguments *)
                              ((ulong)local_c48 ^ 1L << ((ulong)pfVar37 & 0x3f));
                  auVar130._4_4_ = fStack_c24;
                  auVar130._0_4_ = local_c28;
                  auVar130._8_4_ = fStack_c20;
                  auVar130._12_4_ = fStack_c1c;
                  context = local_c00;
                  ray = (Ray *)local_c58;
                  pSVar43 = local_bf0;
                  puVar44 = local_bf8;
                }
                auVar127 = auVar130._0_12_;
              } while (local_c48 != (RTCIntersectArguments *)0x0);
              local_a48 = (ray->org).field_0.m128[0];
              local_a38 = (ray->org).field_0.m128[1];
              local_a28 = (ray->org).field_0.m128[2];
              uVar40 = *(undefined4 *)&(ray->dir).field_0;
              local_c18 = (ray->dir).field_0.m128[1];
              local_be8 = (ray->dir).field_0.m128[2];
              auVar89._4_4_ = uVar40;
              auVar89._0_4_ = uVar40;
              auVar89._8_4_ = uVar40;
              auVar89._12_4_ = uVar40;
              local_c38._0_4_ = local_8a8 - local_a38;
              local_c38._4_4_ = fStack_8a4 - local_a38;
              fStack_c30 = fStack_8a0 - local_a38;
              fStack_c2c = fStack_89c - local_a38;
              fStack_a44 = local_a48;
              fStack_a40 = local_a48;
              fStack_a3c = local_a48;
              fStack_a34 = local_a38;
              fStack_a30 = local_a38;
              fStack_a2c = local_a38;
              fStack_a24 = local_a28;
              fStack_a20 = local_a28;
              fStack_a1c = local_a28;
              local_a88 = ((float)local_8b8 - local_a48) + ((float)local_b28 - local_a48);
              fStack_a84 = (local_8b8._4_4_ - local_a48) + (local_b28._4_4_ - local_a48);
              fStack_a80 = (fStack_8b0 - local_a48) + (fStack_b20 - local_a48);
              fStack_a7c = (fStack_8ac - local_a48) + (fStack_b1c - local_a48);
              local_a68 = (float)local_c38 + (local_898 - local_a38);
              fStack_a64 = local_c38._4_4_ + (fStack_894 - local_a38);
              fStack_a60 = fStack_c30 + (fStack_890 - local_a38);
              fStack_a5c = fStack_c2c + (fStack_88c - local_a38);
              local_a78 = ((float)local_888 - local_a28) + ((float)local_b58 - local_a28);
              fStack_a74 = (local_888._4_4_ - local_a28) + (local_b58._4_4_ - local_a28);
              fStack_a70 = (fStack_880 - local_a28) + (fStack_b50 - local_a28);
              fStack_a6c = (fStack_87c - local_a28) + (fStack_b4c - local_a28);
              local_ab8 = (float)local_b58 - local_a28;
              fStack_ab4 = local_b58._4_4_ - local_a28;
              fStack_ab0 = fStack_b50 - local_a28;
              fStack_aac = fStack_b4c - local_a28;
              local_a98 = local_898 - local_a38;
              fStack_a94 = fStack_894 - local_a38;
              fStack_a90 = fStack_890 - local_a38;
              fStack_a8c = fStack_88c - local_a38;
              local_aa8 = (float)local_b28 - local_a48;
              fStack_aa4 = local_b28._4_4_ - local_a48;
              fStack_aa0 = fStack_b20 - local_a48;
              fStack_a9c = fStack_b1c - local_a48;
              local_bd8._4_4_ = local_888._4_4_ - local_a28;
              local_bd8._0_4_ = (float)local_888 - local_a28;
              fStack_bd0 = fStack_880 - local_a28;
              fStack_bcc = fStack_87c - local_a28;
              local_a58 = (float)local_8b8 - local_a48;
              fStack_a54 = local_8b8._4_4_ - local_a48;
              fStack_a50 = fStack_8b0 - local_a48;
              fStack_a4c = fStack_8ac - local_a48;
            }
          }
          fStack_c14 = local_c18;
          fStack_c10 = local_c18;
          fStack_c0c = local_c18;
          fStack_be4 = local_be8;
          fStack_be0 = local_be8;
          fStack_bdc = local_be8;
          local_c28 = auVar127._8_4_ - fStack_a1c;
          fStack_c24 = (float)uStack_850 - fStack_a1c;
          fStack_c20 = (float)uStack_870 - fStack_a1c;
          fStack_c1c = (float)uStack_860 - fStack_a1c;
          fVar151 = auVar127._0_4_ - fStack_a3c;
          fVar153 = (float)local_858 - fStack_a3c;
          fVar154 = (float)local_878 - fStack_a3c;
          fVar155 = (float)local_868 - fStack_a3c;
          local_b38 = auVar127._4_4_ - fStack_a2c;
          fStack_b34 = local_858._4_4_ - fStack_a2c;
          fStack_b30 = local_878._4_4_ - fStack_a2c;
          fStack_b2c = local_868._4_4_ - fStack_a2c;
          fVar134 = local_a98 - local_b38;
          fVar137 = fStack_a94 - fStack_b34;
          fStack_b60 = fStack_a90 - fStack_b30;
          fStack_b5c = fStack_a8c - fStack_b2c;
          fVar139 = local_ab8 - local_c28;
          fVar144 = fStack_ab4 - fStack_c24;
          fStack_b20 = fStack_ab0 - fStack_c20;
          fStack_b1c = fStack_aac - fStack_c1c;
          local_c58._0_4_ = (float)local_c38 - local_a98;
          local_c58._4_4_ = local_c38._4_4_ - fStack_a94;
          fStack_c50 = fStack_c30 - fStack_a90;
          fStack_c4c = fStack_c2c - fStack_a8c;
          fVar60 = (float)local_bd8._0_4_ - local_ab8;
          fVar118 = (float)local_bd8._4_4_ - fStack_ab4;
          fStack_c40 = fStack_bd0 - fStack_ab0;
          fStack_c3c = fStack_bcc - fStack_aac;
          local_c48 = (RTCIntersectArguments *)CONCAT44(fVar118,fVar60);
          local_af8 = local_aa8 - fVar151;
          fStack_af4 = fStack_aa4 - fVar153;
          fStack_af0 = fStack_aa0 - fVar154;
          fStack_aec = fStack_a9c - fVar155;
          fVar95 = local_a58 - local_aa8;
          fVar81 = fStack_a54 - fStack_aa4;
          fStack_b50 = fStack_a50 - fStack_aa0;
          fStack_b4c = fStack_a4c - fStack_a9c;
          local_b58 = CONCAT44(fVar81,fVar95);
          local_b28 = CONCAT44(fVar144,fVar139);
          _local_b68 = CONCAT44(fVar137,fVar134);
          fVar77 = auVar89._0_4_;
          fVar78 = auVar89._4_4_;
          fVar104 = auVar89._8_4_;
          fVar106 = auVar89._12_4_;
          fVar108 = (fVar134 * (local_ab8 + local_c28) - fVar139 * (local_a98 + local_b38)) * fVar77
                    + (fVar139 * (local_aa8 + fVar151) - (local_ab8 + local_c28) * local_af8) *
                      local_c18 +
                      ((local_a98 + local_b38) * local_af8 - (local_aa8 + fVar151) * fVar134) *
                      local_be8;
          fVar110 = (fVar137 * (fStack_ab4 + fStack_c24) - fVar144 * (fStack_a94 + fStack_b34)) *
                    fVar78 + (fVar144 * (fStack_aa4 + fVar153) -
                             (fStack_ab4 + fStack_c24) * fStack_af4) * local_c18 +
                             ((fStack_a94 + fStack_b34) * fStack_af4 -
                             (fStack_aa4 + fVar153) * fVar137) * local_be8;
          local_a18._0_8_ = CONCAT44(fVar110,fVar108);
          local_a18._8_4_ =
               (fStack_b60 * (fStack_ab0 + fStack_c20) - fStack_b20 * (fStack_a90 + fStack_b30)) *
               fVar104 + (fStack_b20 * (fStack_aa0 + fVar154) -
                         (fStack_ab0 + fStack_c20) * fStack_af0) * local_c18 +
                         ((fStack_a90 + fStack_b30) * fStack_af0 -
                         (fStack_aa0 + fVar154) * fStack_b60) * local_be8;
          fStack_a0c = (fStack_b5c * (fStack_aac + fStack_c1c) -
                       fStack_b1c * (fStack_a8c + fStack_b2c)) * fVar106 +
                       (fStack_b1c * (fStack_a9c + fVar155) - (fStack_aac + fStack_c1c) * fStack_aec
                       ) * local_c18 +
                       ((fStack_a8c + fStack_b2c) * fStack_aec - (fStack_a9c + fVar155) * fStack_b5c
                       ) * local_be8;
          fVar138 = local_b38 - (float)local_c38;
          fVar143 = fStack_b34 - local_c38._4_4_;
          fVar146 = fStack_b30 - fStack_c30;
          fVar148 = fStack_b2c - fStack_c2c;
          fVar140 = local_c28 - (float)local_bd8._0_4_;
          fVar145 = fStack_c24 - (float)local_bd8._4_4_;
          fVar147 = fStack_c20 - fStack_bd0;
          fVar149 = fStack_c1c - fStack_bcc;
          fVar79 = (float)local_c38 + local_b38;
          fVar93 = local_c38._4_4_ + fStack_b34;
          fVar62 = fStack_c30 + fStack_b30;
          fVar74 = fStack_c2c + fStack_b2c;
          fVar122 = fVar151 - local_a58;
          fVar124 = fVar153 - fStack_a54;
          fVar125 = fVar154 - fStack_a50;
          fVar126 = fVar155 - fStack_a4c;
          local_c38 = (Geometry *)CONCAT44(fVar153,fVar151);
          fStack_c30 = fVar154;
          fStack_c2c = fVar155;
          fStack_b00 = (float)local_a18._8_4_;
          local_b08 = (undefined1  [8])local_a18._0_8_;
          fStack_afc = fStack_a0c;
          local_bd8._0_4_ =
               (fVar138 * ((float)local_bd8._0_4_ + local_c28) - fVar140 * fVar79) * fVar77 +
               (fVar140 * (local_a58 + fVar151) - ((float)local_bd8._0_4_ + local_c28) * fVar122) *
               local_c18 + (fVar79 * fVar122 - (local_a58 + fVar151) * fVar138) * local_be8;
          local_bd8._4_4_ =
               (fVar143 * ((float)local_bd8._4_4_ + fStack_c24) - fVar145 * fVar93) * fVar78 +
               (fVar145 * (fStack_a54 + fVar153) - ((float)local_bd8._4_4_ + fStack_c24) * fVar124)
               * local_c18 + (fVar93 * fVar124 - (fStack_a54 + fVar153) * fVar143) * local_be8;
          fStack_bd0 = (fVar146 * (fStack_bd0 + fStack_c20) - fVar147 * fVar62) * fVar104 +
                       (fVar147 * (fStack_a50 + fVar154) - (fStack_bd0 + fStack_c20) * fVar125) *
                       local_c18 + (fVar62 * fVar125 - (fStack_a50 + fVar154) * fVar146) * local_be8
          ;
          fStack_bcc = (fVar148 * (fStack_bcc + fStack_c1c) - fVar149 * fVar74) * fVar106 +
                       (fVar149 * (fStack_a4c + fVar155) - (fStack_bcc + fStack_c1c) * fVar126) *
                       local_c18 + (fVar74 * fVar126 - (fStack_a4c + fVar155) * fVar148) * local_be8
          ;
          auVar56._0_4_ =
               ((float)local_c58._0_4_ * local_a78 - fVar60 * local_a68) * fVar77 +
               (fVar60 * local_a88 - local_a78 * fVar95) * local_c18 +
               (local_a68 * fVar95 - local_a88 * (float)local_c58._0_4_) * local_be8;
          auVar56._4_4_ =
               ((float)local_c58._4_4_ * fStack_a74 - fVar118 * fStack_a64) * fVar78 +
               (fVar118 * fStack_a84 - fStack_a74 * fVar81) * local_c18 +
               (fStack_a64 * fVar81 - fStack_a84 * (float)local_c58._4_4_) * local_be8;
          auVar56._8_4_ =
               (fStack_c50 * fStack_a70 - fStack_c40 * fStack_a60) * fVar104 +
               (fStack_c40 * fStack_a80 - fStack_a70 * fStack_b50) * local_c18 +
               (fStack_a60 * fStack_b50 - fStack_a80 * fStack_c50) * local_be8;
          auVar56._12_4_ =
               (fStack_c4c * fStack_a6c - fStack_c3c * fStack_a5c) * fVar106 +
               (fStack_c3c * fStack_a7c - fStack_a6c * fStack_b4c) * local_c18 +
               (fStack_a5c * fStack_b4c - fStack_a7c * fStack_c4c) * local_be8;
          local_b18 = fVar108 + (float)local_bd8._0_4_ + auVar56._0_4_;
          fStack_b14 = fVar110 + (float)local_bd8._4_4_ + auVar56._4_4_;
          fStack_b10 = (float)local_a18._8_4_ + fStack_bd0 + auVar56._8_4_;
          fStack_b0c = fStack_a0c + fStack_bcc + auVar56._12_4_;
          auVar66._8_4_ = local_a18._8_4_;
          auVar66._0_8_ = local_a18._0_8_;
          auVar66._12_4_ = fStack_a0c;
          auVar48 = minps(auVar66,_local_bd8);
          auVar48 = minps(auVar48,auVar56);
          auVar82 = maxps(_local_b08,_local_bd8);
          auVar82 = maxps(auVar82,auVar56);
          fVar79 = ABS(local_b18) * 1.1920929e-07;
          fVar93 = ABS(fStack_b14) * 1.1920929e-07;
          fVar62 = ABS(fStack_b10) * 1.1920929e-07;
          fVar74 = ABS(fStack_b0c) * 1.1920929e-07;
          auVar136._4_4_ = -(uint)(auVar82._4_4_ <= fVar93);
          auVar136._0_4_ = -(uint)(auVar82._0_4_ <= fVar79);
          auVar136._8_4_ = -(uint)(auVar82._8_4_ <= fVar62);
          auVar136._12_4_ = -(uint)(auVar82._12_4_ <= fVar74);
          auVar67._4_4_ = -(uint)(-fVar93 <= auVar48._4_4_);
          auVar67._0_4_ = -(uint)(-fVar79 <= auVar48._0_4_);
          auVar67._8_4_ = -(uint)(-fVar62 <= auVar48._8_4_);
          auVar67._12_4_ = -(uint)(-fVar74 <= auVar48._12_4_);
          auVar136 = auVar136 | auVar67;
          iVar45 = movmskps((int)pfVar37,auVar136);
          if (iVar45 != 0) {
            auVar131._0_4_ = fVar134 * fVar140 - fVar139 * fVar138;
            auVar131._4_4_ = fVar137 * fVar145 - fVar144 * fVar143;
            auVar131._8_4_ = fStack_b60 * fVar147 - fStack_b20 * fVar146;
            auVar131._12_4_ = fStack_b5c * fVar149 - fStack_b1c * fVar148;
            auVar121._0_4_ = fVar138 * fVar60 - fVar140 * (float)local_c58._0_4_;
            auVar121._4_4_ = fVar143 * fVar118 - fVar145 * (float)local_c58._4_4_;
            auVar121._8_4_ = fVar146 * fStack_c40 - fVar147 * fStack_c50;
            auVar121._12_4_ = fVar148 * fStack_c3c - fVar149 * fStack_c4c;
            auVar57._4_4_ = -(uint)(ABS(fVar144 * fVar143) < ABS(fVar145 * (float)local_c58._4_4_));
            auVar57._0_4_ = -(uint)(ABS(fVar139 * fVar138) < ABS(fVar140 * (float)local_c58._0_4_));
            auVar57._8_4_ = -(uint)(ABS(fStack_b20 * fVar146) < ABS(fVar147 * fStack_c50));
            auVar57._12_4_ = -(uint)(ABS(fStack_b1c * fVar148) < ABS(fVar149 * fStack_c4c));
            local_9e8 = blendvps(auVar121,auVar131,auVar57);
            auVar142._0_4_ = fVar140 * fVar95 - fVar122 * fVar60;
            auVar142._4_4_ = fVar145 * fVar81 - fVar124 * fVar118;
            auVar142._8_4_ = fVar147 * fStack_b50 - fVar125 * fStack_c40;
            auVar142._12_4_ = fVar149 * fStack_b4c - fVar126 * fStack_c3c;
            auVar58._4_4_ = -(uint)(ABS(fStack_af4 * fVar145) < ABS(fVar124 * fVar118));
            auVar58._0_4_ = -(uint)(ABS(local_af8 * fVar140) < ABS(fVar122 * fVar60));
            auVar58._8_4_ = -(uint)(ABS(fStack_af0 * fVar147) < ABS(fVar125 * fStack_c40));
            auVar58._12_4_ = -(uint)(ABS(fStack_aec * fVar149) < ABS(fVar126 * fStack_c3c));
            auVar32._4_4_ = fVar144 * fVar124 - fStack_af4 * fVar145;
            auVar32._0_4_ = fVar139 * fVar122 - local_af8 * fVar140;
            auVar32._8_4_ = fStack_b20 * fVar125 - fStack_af0 * fVar147;
            auVar32._12_4_ = fStack_b1c * fVar126 - fStack_aec * fVar149;
            local_9d8 = blendvps(auVar142,auVar32,auVar58);
            fVar139 = (float)DAT_01f7ba10;
            fVar140 = DAT_01f7ba10._4_4_;
            fVar144 = DAT_01f7ba10._12_4_;
            auVar100._0_4_ = local_af8 * fVar138 - fVar134 * fVar122;
            auVar100._4_4_ = fStack_af4 * fVar143 - fVar137 * fVar124;
            auVar100._8_4_ = fStack_af0 * fVar146 - fStack_b60 * fVar125;
            auVar100._12_4_ = fStack_aec * fVar148 - fStack_b5c * fVar126;
            auVar123._0_4_ = fVar122 * (float)local_c58._0_4_ - fVar138 * fVar95;
            auVar123._4_4_ = fVar124 * (float)local_c58._4_4_ - fVar143 * fVar81;
            auVar123._8_4_ = fVar125 * fStack_c50 - fVar146 * fStack_b50;
            auVar123._12_4_ = fVar126 * fStack_c4c - fVar148 * fStack_b4c;
            auVar59._4_4_ = -(uint)(ABS(fVar137 * fVar124) < ABS(fVar143 * fVar81));
            auVar59._0_4_ = -(uint)(ABS(fVar134 * fVar122) < ABS(fVar138 * fVar95));
            auVar59._8_4_ = -(uint)(ABS(fStack_b60 * fVar125) < ABS(fVar146 * fStack_b50));
            auVar59._12_4_ = -(uint)(ABS(fStack_b5c * fVar126) < ABS(fVar148 * fStack_b4c));
            local_9c8 = blendvps(auVar123,auVar100,auVar59);
            fVar134 = fVar77 * local_9e8._0_4_ +
                      local_c18 * local_9d8._0_4_ + local_be8 * local_9c8._0_4_;
            fVar78 = fVar78 * local_9e8._4_4_ +
                     local_c18 * local_9d8._4_4_ + local_be8 * local_9c8._4_4_;
            fVar104 = fVar104 * local_9e8._8_4_ +
                      local_c18 * local_9d8._8_4_ + local_be8 * local_9c8._8_4_;
            fVar106 = fVar106 * local_9e8._12_4_ +
                      local_c18 * local_9d8._12_4_ + local_be8 * local_9c8._12_4_;
            fVar134 = fVar134 + fVar134;
            fVar78 = fVar78 + fVar78;
            fVar104 = fVar104 + fVar104;
            fVar106 = fVar106 + fVar106;
            auVar68._0_4_ = local_c28 * local_9c8._0_4_;
            auVar68._4_4_ = fStack_c24 * local_9c8._4_4_;
            auVar68._8_4_ = fStack_c20 * local_9c8._8_4_;
            auVar68._12_4_ = fStack_c1c * local_9c8._12_4_;
            fVar93 = fVar151 * local_9e8._0_4_ + local_b38 * local_9d8._0_4_ + auVar68._0_4_;
            fVar62 = fVar153 * local_9e8._4_4_ + fStack_b34 * local_9d8._4_4_ + auVar68._4_4_;
            fVar74 = fVar154 * local_9e8._8_4_ + fStack_b30 * local_9d8._8_4_ + auVar68._8_4_;
            fVar77 = fVar155 * local_9e8._12_4_ + fStack_b2c * local_9d8._12_4_ + auVar68._12_4_;
            auVar33._4_4_ = fVar78;
            auVar33._0_4_ = fVar134;
            auVar33._8_4_ = fVar104;
            auVar33._12_4_ = fVar106;
            auVar48 = rcpps(auVar68,auVar33);
            fVar60 = auVar48._0_4_;
            fVar95 = auVar48._4_4_;
            fVar118 = auVar48._8_4_;
            fVar81 = auVar48._12_4_;
            fVar79 = DAT_01f7ba10._8_4_;
            local_988._0_4_ = ((fVar139 - fVar134 * fVar60) * fVar60 + fVar60) * (fVar93 + fVar93);
            local_988._4_4_ = ((fVar140 - fVar78 * fVar95) * fVar95 + fVar95) * (fVar62 + fVar62);
            fStack_980 = ((fVar79 - fVar104 * fVar118) * fVar118 + fVar118) * (fVar74 + fVar74);
            fStack_97c = ((fVar144 - fVar106 * fVar81) * fVar81 + fVar81) * (fVar77 + fVar77);
            fVar60 = ray->tfar;
            fVar95 = (ray->org).field_0.m128[3];
            auVar90._0_4_ =
                 -(uint)((float)local_988._0_4_ <= fVar60 && fVar95 <= (float)local_988._0_4_);
            auVar90._4_4_ =
                 -(uint)((float)local_988._4_4_ <= fVar60 && fVar95 <= (float)local_988._4_4_);
            auVar90._8_4_ = -(uint)(fStack_980 <= fVar60 && fVar95 <= fStack_980);
            auVar90._12_4_ = -(uint)(fStack_97c <= fVar60 && fVar95 <= fStack_97c);
            local_9b8._0_4_ = -(uint)(fVar134 != 0.0) & auVar136._0_4_ & auVar90._0_4_;
            local_9b8._4_4_ = -(uint)(fVar78 != 0.0) & auVar136._4_4_ & auVar90._4_4_;
            local_9b8._8_4_ = -(uint)(fVar104 != 0.0) & auVar136._8_4_ & auVar90._8_4_;
            local_9b8._12_4_ = -(uint)(fVar106 != 0.0) & auVar136._12_4_ & auVar90._12_4_;
            auVar34._4_4_ = local_9b8._4_4_;
            auVar34._0_4_ = local_9b8._0_4_;
            auVar34._8_4_ = local_9b8._8_4_;
            auVar34._12_4_ = local_9b8._12_4_;
            uVar38 = movmskps(iVar45,auVar34);
            if (uVar38 != 0) {
              _local_a08 = _local_bd8;
              local_9f8._4_4_ = fStack_b14;
              local_9f8._0_4_ = local_b18;
              local_9f8._8_4_ = fStack_b10;
              local_9f8._12_4_ = fStack_b0c;
              local_948._8_8_ = uStack_ac0;
              local_948._0_8_ = local_ac8;
              auVar48 = rcpps(auVar90,local_9f8);
              fVar60 = auVar48._0_4_;
              fVar95 = auVar48._4_4_;
              fVar118 = auVar48._8_4_;
              fVar81 = auVar48._12_4_;
              fVar60 = (float)(-(uint)(1e-18 <= ABS(local_b18)) &
                              (uint)((fVar139 - local_b18 * fVar60) * fVar60 + fVar60));
              fVar95 = (float)(-(uint)(1e-18 <= ABS(fStack_b14)) &
                              (uint)((fVar140 - fStack_b14 * fVar95) * fVar95 + fVar95));
              fVar118 = (float)(-(uint)(1e-18 <= ABS(fStack_b10)) &
                               (uint)((fVar79 - fStack_b10 * fVar118) * fVar118 + fVar118));
              fVar81 = (float)(-(uint)(1e-18 <= ABS(fStack_b0c)) &
                              (uint)((fVar144 - fStack_b0c * fVar81) * fVar81 + fVar81));
              auVar133._0_4_ = fVar108 * fVar60;
              auVar133._4_4_ = fVar110 * fVar95;
              auVar133._8_4_ = (float)local_a18._8_4_ * fVar118;
              auVar133._12_4_ = fStack_a0c * fVar81;
              auVar48 = minps(auVar133,_DAT_01f7ba10);
              auVar152._0_4_ = fVar60 * (float)local_bd8._0_4_;
              auVar152._4_4_ = fVar95 * (float)local_bd8._4_4_;
              auVar152._8_4_ = fVar118 * fStack_bd0;
              auVar152._12_4_ = fVar81 * fStack_bcc;
              auVar82 = minps(auVar152,_DAT_01f7ba10);
              auVar69._0_4_ = fVar139 - auVar48._0_4_;
              auVar69._4_4_ = fVar140 - auVar48._4_4_;
              auVar69._8_4_ = fVar79 - auVar48._8_4_;
              auVar69._12_4_ = fVar144 - auVar48._12_4_;
              auVar91._0_4_ = fVar139 - auVar82._0_4_;
              auVar91._4_4_ = fVar140 - auVar82._4_4_;
              auVar91._8_4_ = fVar79 - auVar82._8_4_;
              auVar91._12_4_ = fVar144 - auVar82._12_4_;
              local_9a8 = blendvps(auVar48,auVar69,local_948);
              local_998 = blendvps(auVar82,auVar91,local_948);
              local_978 = local_9e8;
              local_968 = local_9d8;
              local_958 = local_9c8;
              uVar36 = (ulong)(uVar38 & 0xff);
              local_a48 = fStack_a3c;
              fStack_a44 = fStack_a3c;
              fStack_a40 = fStack_a3c;
              local_a38 = fStack_a2c;
              fStack_a34 = fStack_a2c;
              fStack_a30 = fStack_a2c;
              local_a28 = fStack_a1c;
              fStack_a24 = fStack_a1c;
              fStack_a20 = fStack_a1c;
              do {
                uVar22 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                local_c38 = (pSVar43->geometries).items[puVar44[uVar22]].ptr;
                if ((local_c38->mask & ray->mask) == 0) {
                  uVar36 = uVar36 ^ 1L << (uVar22 & 0x3f);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0022be29:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_c48 = context->args;
                  local_c18 = (float)uVar36;
                  fStack_c14 = (float)(uVar36 >> 0x20);
                  local_b98.context = context->user;
                  local_bc8 = *(undefined4 *)(local_978 + uVar22 * 4);
                  local_bc4 = *(undefined4 *)(local_968 + uVar22 * 4);
                  local_bc0 = *(undefined4 *)(local_958 + uVar22 * 4);
                  local_bbc = *(undefined4 *)(local_9a8 + uVar22 * 4);
                  local_bb8 = *(undefined4 *)(local_998 + uVar22 * 4);
                  local_bb4 = *(undefined4 *)(local_b40 + 0x50 + uVar22 * 4);
                  local_bb0 = puVar44[uVar22];
                  local_bac = (local_b98.context)->instID[0];
                  local_ba8 = (local_b98.context)->instPrimID[0];
                  local_be8 = ray->tfar;
                  local_c28 = (float)uVar22;
                  fStack_c24 = (float)(uVar22 >> 0x20);
                  ray->tfar = *(float *)(local_988 + uVar22 * 4);
                  local_c5c = -1;
                  local_b98.valid = &local_c5c;
                  local_b98.geometryUserPtr = local_c38->userPtr;
                  local_c58 = (undefined1  [8])ray;
                  local_b98.hit = (RTCHitN *)&local_bc8;
                  local_b98.N = 1;
                  local_b98.ray = (RTCRayN *)ray;
                  if ((local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*local_c38->occlusionFilterN)(&local_b98), *local_b98.valid != 0)) {
                    ray = (Ray *)local_c58;
                    if ((local_c48->filter == (RTCFilterFunctionN)0x0) ||
                       (((local_c48->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_c38->field_8).field_0x2 & 0x40) == 0)))) goto LAB_0022be29;
                    (*local_c48->filter)(&local_b98);
                    ray = (Ray *)local_c58;
                    if (*local_b98.valid != 0) goto LAB_0022be29;
                  }
                  *(float *)((long)local_c58 + 0x20) = local_be8;
                  uVar36 = CONCAT44(fStack_c14,local_c18) ^ 1L << ((ulong)(uint)local_c28 & 0x3f);
                  context = local_c00;
                  ray = (Ray *)local_c58;
                  pSVar43 = local_bf0;
                  puVar44 = local_bf8;
                }
              } while (uVar36 != 0);
            }
          }
          local_ad0 = local_ad0 + 1;
        } while (local_ad0 != local_ae8);
      }
LAB_0022be19:
    } while (local_ad8 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }